

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O2

void __thiscall
jwt::algorithm::rsa::rsa
          (rsa *this,string *public_key,string *private_key,string *public_key_password,
          string *private_key_password,_func_EVP_MD_ptr *md,string *name)

{
  rsa_exception *this_00;
  __shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (this->pkey).super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pkey).super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->md = md;
  std::__cxx11::string::string((string *)&this->alg_name,(string *)name);
  if (private_key->_M_string_length == 0) {
    if (public_key->_M_string_length == 0) {
      this_00 = (rsa_exception *)__cxa_allocate_exception(0x10);
      rsa_exception::rsa_exception
                (this_00,"at least one of public or private key need to be present");
      __cxa_throw(this_00,&rsa_exception::typeinfo,std::runtime_error::~runtime_error);
    }
    helper::load_public_key_from_string((helper *)&local_40,public_key,public_key_password);
  }
  else {
    helper::load_private_key_from_string((helper *)&local_40,private_key,private_key_password);
  }
  std::__shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2> *)this,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

rsa(const std::string& public_key, const std::string& private_key, const std::string& public_key_password, const std::string& private_key_password, const EVP_MD*(*md)(), const std::string& name)
				: md(md), alg_name(name)
			{
				if (!private_key.empty()) {
					pkey = helper::load_private_key_from_string(private_key, private_key_password);
				} else if(!public_key.empty()) {
					pkey = helper::load_public_key_from_string(public_key, public_key_password);
				} else
					throw rsa_exception("at least one of public or private key need to be present");
			}